

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiColumnsFlags flags)

{
  ImVector<ImGuiColumnData> *this;
  ImVector<ImGuiColumnsSet> *this_00;
  ImGuiWindow *this_01;
  ImGuiContext *pIVar1;
  ImGuiID IVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  ImGuiContext *g;
  int iVar5;
  char *str;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 local_70 [20];
  ImVec2 IStack_5c;
  ImVector<ImGuiColumnData> local_40;
  
  pIVar1 = GImGui;
  this_01 = GImGui->CurrentWindow;
  this_01->WriteAccessed = true;
  if (columns_count < 2) {
    __assert_fail("columns_count > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x3253,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  if ((this_01->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
    __assert_fail("window->DC.ColumnsSet == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x3254,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  iVar5 = columns_count + 0x11223347;
  if (str_id != (char *)0x0) {
    iVar5 = 0x11223347;
  }
  str = "columns";
  if (str_id != (char *)0x0) {
    str = str_id;
  }
  PushID(iVar5);
  iVar5 = 0;
  IVar2 = ImGuiWindow::GetID(this_01,str,(char *)0x0);
  PopID();
  this_00 = &this_01->ColumnsStorage;
  do {
    if (this_00->Size <= iVar5) {
      ImGuiColumnsSet::ImGuiColumnsSet((ImGuiColumnsSet *)local_70);
      ImVector<ImGuiColumnsSet>::push_back(this_00,(ImGuiColumnsSet *)local_70);
      ImVector<ImGuiColumnData>::~ImVector(&local_40);
      pvVar3 = ImVector<ImGuiColumnsSet>::back(this_00);
      pvVar3->ID = IVar2;
LAB_0018c9f8:
      pvVar3->Current = 0;
      pvVar3->Count = columns_count;
      pvVar3->Flags = flags;
      (this_01->DC).ColumnsSet = pvVar3;
      fVar9 = (this_01->SizeContentsExplicit).x;
      if ((fVar9 != 0.0) || (NAN(fVar9))) {
        fVar7 = (this_01->Pos).x;
      }
      else {
        fVar7 = (this_01->Pos).x;
        fVar9 = (this_01->InnerClipRect).Max.x - fVar7;
      }
      fVar8 = (this_01->DC).IndentX;
      fVar10 = fVar8 - (pIVar1->Style).ItemSpacing.x;
      pvVar3->MinX = fVar10;
      fVar9 = fVar9 - (this_01->Scroll).x;
      fVar10 = fVar10 + 1.0;
      uVar6 = -(uint)(fVar10 <= fVar9);
      pvVar3->MaxX = (float)(~uVar6 & (uint)fVar10 | (uint)fVar9 & uVar6);
      fVar9 = (this_01->DC).CursorPos.y;
      pvVar3->StartPosY = fVar9;
      pvVar3->StartMaxPosX = (this_01->DC).CursorMaxPos.x;
      pvVar3->LineMaxY = fVar9;
      pvVar3->LineMinY = fVar9;
      (this_01->DC).ColumnsOffsetX = 0.0;
      (this_01->DC).CursorPos.x = (float)(int)(fVar7 + fVar8 + 0.0);
      this = &pvVar3->Columns;
      iVar5 = (pvVar3->Columns).Size;
      if (iVar5 != columns_count + 1 && iVar5 != 0) {
        ImVector<ImGuiColumnData>::resize(this,0);
        iVar5 = this->Size;
      }
      pvVar3->IsFirstFrame = iVar5 == 0;
      if (iVar5 == 0) {
        ImVector<ImGuiColumnData>::reserve(this,columns_count + 1);
        for (iVar5 = 0; iVar5 <= columns_count; iVar5 = iVar5 + 1) {
          local_70._12_4_ = 3.4028235e+38;
          local_70._16_4_ = 3.4028235e+38;
          IStack_5c.x = -3.4028235e+38;
          IStack_5c.y = -3.4028235e+38;
          local_70._4_4_ = 0;
          local_70[8] = false;
          local_70[9] = false;
          local_70._10_2_ = 0;
          local_70._0_4_ = (float)iVar5 / (float)columns_count;
          ImVector<ImGuiColumnData>::push_back(this,(value_type *)local_70);
        }
      }
      iVar5 = 0;
      while (columns_count != iVar5) {
        pvVar4 = ImVector<ImGuiColumnData>::operator[](this,iVar5);
        fVar9 = (this_01->Pos).x;
        fVar8 = GetColumnOffset(iVar5);
        fVar7 = (this_01->Pos).x;
        iVar5 = iVar5 + 1;
        fVar10 = GetColumnOffset(iVar5);
        (pvVar4->ClipRect).Min.x = (float)(int)(fVar8 + fVar9 + 0.5 + -1.0);
        (pvVar4->ClipRect).Min.y = -3.4028235e+38;
        (pvVar4->ClipRect).Max.x = (float)(int)(fVar10 + fVar7 + 0.5 + -1.0);
        (pvVar4->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWith(&pvVar4->ClipRect,&this_01->ClipRect);
      }
      ImDrawList::ChannelsSplit(this_01->DrawList,pvVar3->Count);
      PushColumnClipRect(-1);
      fVar9 = GetColumnWidth(-1);
      PushItemWidth(fVar9 * 0.65);
      return;
    }
    pvVar3 = ImVector<ImGuiColumnsSet>::operator[](this_00,iVar5);
    if (pvVar3->ID == IVar2) {
      pvVar3 = ImVector<ImGuiColumnsSet>::operator[](this_00,iVar5);
      if (pvVar3->ID != IVar2) {
        __assert_fail("columns->ID == id",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0x325e,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
      }
      goto LAB_0018c9f8;
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiColumnsFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count > 1);
    IM_ASSERT(window->DC.ColumnsSet == NULL); // Nested columns are currently not supported

    // Differentiate column ID with an arbitrary prefix for cases where users name their columns set the same as another widget.
    // In addition, when an identifier isn't explicitly provided we include the number of columns in the hash to make it uniquer.
    PushID(0x11223347 + (str_id ? 0 : columns_count));
    ImGuiID id = window->GetID(str_id ? str_id : "columns");
    PopID();

    // Acquire storage for the columns set
    ImGuiColumnsSet* columns = FindOrAddColumnsSet(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.ColumnsSet = columns;

    // Set state for first column
    const float content_region_width = (window->SizeContentsExplicit.x != 0.0f) ? (window->SizeContentsExplicit.x) : (window->InnerClipRect.Max.x - window->Pos.x);
    columns->MinX = window->DC.IndentX - g.Style.ItemSpacing.x; // Lock our horizontal range
    columns->MaxX = ImMax(content_region_width - window->Scroll.x, columns->MinX + 1.0f);
    columns->StartPosY = window->DC.CursorPos.y;
    columns->StartMaxPosX = window->DC.CursorMaxPos.x;
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;
    window->DC.ColumnsOffsetX = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.IndentX + window->DC.ColumnsOffsetX);

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize defaults
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiColumnData* column = &columns->Columns[n];
        float clip_x1 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n) - 1.0f);
        float clip_x2 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWith(window->ClipRect);
    }

    window->DrawList->ChannelsSplit(columns->Count);
    PushColumnClipRect();
    PushItemWidth(GetColumnWidth() * 0.65f);
}